

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_mul.c
# Opt level: O0

void ppMul9(word *c,word *a,word *b,void *stack)

{
  word *in_RCX;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *t;
  
  ppMul3(in_RDI,in_RSI,in_RDX,in_RCX);
  ppMul3(in_RDI + 6,in_RSI + 3,in_RDX + 3,in_RCX);
  ppMul3(in_RDI + 0xc,in_RSI + 6,in_RDX + 6,in_RCX);
  in_RDI[3] = *in_RDI ^ in_RDI[6] ^ in_RDI[3];
  in_RDI[4] = in_RDI[1] ^ in_RDI[7] ^ in_RDI[4];
  in_RDI[5] = in_RDI[2] ^ in_RDI[8] ^ in_RDI[5];
  in_RDI[6] = in_RDI[3] ^ in_RDI[9] ^ in_RDI[0xc];
  in_RDI[7] = in_RDI[4] ^ in_RDI[10] ^ in_RDI[0xd];
  in_RDI[8] = in_RDI[5] ^ in_RDI[0xb] ^ in_RDI[0xe];
  in_RDI[9] = in_RDI[6] ^ *in_RDI ^ in_RDI[0xf];
  in_RDI[10] = in_RDI[7] ^ in_RDI[1] ^ in_RDI[0x10];
  in_RDI[0xb] = in_RDI[8] ^ in_RDI[2] ^ in_RDI[0x11];
  in_RDI[0xc] = in_RDI[9] ^ *in_RDI ^ in_RDI[3];
  in_RDI[0xd] = in_RDI[10] ^ in_RDI[1] ^ in_RDI[4];
  in_RDI[0xe] = in_RDI[0xb] ^ in_RDI[2] ^ in_RDI[5];
  in_RCX[6] = *in_RSI ^ in_RSI[3];
  in_RCX[7] = in_RSI[1] ^ in_RSI[4];
  in_RCX[8] = in_RSI[2] ^ in_RSI[5];
  in_RCX[9] = *in_RDX ^ in_RDX[3];
  in_RCX[10] = in_RDX[1] ^ in_RDX[4];
  in_RCX[0xb] = in_RDX[2] ^ in_RDX[5];
  in_RCX[0xc] = *in_RSI ^ in_RSI[6];
  in_RCX[0xd] = in_RSI[1] ^ in_RSI[7];
  in_RCX[0xe] = in_RSI[2] ^ in_RSI[8];
  in_RCX[0xf] = *in_RDX ^ in_RDX[6];
  in_RCX[0x10] = in_RDX[1] ^ in_RDX[7];
  in_RCX[0x11] = in_RDX[2] ^ in_RDX[8];
  ppMul3(in_RCX,in_RCX + 6,in_RCX + 9,in_RCX + 0x12);
  in_RDI[3] = *in_RCX ^ in_RDI[3];
  in_RDI[4] = in_RCX[1] ^ in_RDI[4];
  in_RDI[5] = in_RCX[2] ^ in_RDI[5];
  in_RDI[6] = in_RCX[3] ^ in_RDI[6];
  in_RDI[7] = in_RCX[4] ^ in_RDI[7];
  in_RDI[8] = in_RCX[5] ^ in_RDI[8];
  ppMul3(in_RCX,in_RCX + 0xc,in_RCX + 0xf,in_RCX + 0x12);
  in_RDI[6] = *in_RCX ^ in_RDI[6];
  in_RDI[7] = in_RCX[1] ^ in_RDI[7];
  in_RDI[8] = in_RCX[2] ^ in_RDI[8];
  in_RDI[9] = in_RCX[3] ^ in_RDI[9];
  in_RDI[10] = in_RCX[4] ^ in_RDI[10];
  in_RDI[0xb] = in_RCX[5] ^ in_RDI[0xb];
  in_RCX[0xc] = in_RCX[6] ^ in_RCX[0xc];
  in_RCX[0xd] = in_RCX[7] ^ in_RCX[0xd];
  in_RCX[0xe] = in_RCX[8] ^ in_RCX[0xe];
  in_RCX[0xf] = in_RCX[9] ^ in_RCX[0xf];
  in_RCX[0x10] = in_RCX[10] ^ in_RCX[0x10];
  in_RCX[0x11] = in_RCX[0xb] ^ in_RCX[0x11];
  ppMul3(in_RCX,in_RCX + 0xc,in_RCX + 0xf,in_RCX + 0x12);
  in_RDI[9] = *in_RCX ^ in_RDI[9];
  in_RDI[10] = in_RCX[1] ^ in_RDI[10];
  in_RDI[0xb] = in_RCX[2] ^ in_RDI[0xb];
  in_RDI[0xc] = in_RCX[3] ^ in_RDI[0xc];
  in_RDI[0xd] = in_RCX[4] ^ in_RDI[0xd];
  in_RDI[0xe] = in_RCX[5] ^ in_RDI[0xe];
  return;
}

Assistant:

static void ppMul9(word c[18], const word a[9], const word b[9], void* stack)
{
	word* t = (word*)stack;
	ASSERT(wwIsDisjoint2(a, 9, c, 18));
	ASSERT(wwIsDisjoint2(b, 9, c, 18));
	// c1 || c0 <- a0 b0
	ppMul3(c, a, b, t);
	// c3 || c2 <- a1 b1
	ppMul3(c + 6, a + 3, b + 3, t);
	// c5 || c4 <- a2 b2
	ppMul3(c + 12, a + 6, b + 6, t);
	// c1 <- c1 + c0 + c2
	c[3] ^= c[0] ^ c[6];
	c[4] ^= c[1] ^ c[7];
	c[5] ^= c[2] ^ c[8];
	// c2 <- c1 + c3 + c4
	c[6] = c[3] ^ c[9] ^ c[12];
	c[7] = c[4] ^ c[10] ^ c[13];
	c[8] = c[5] ^ c[11] ^ c[14];
	// c3 <- c2 + c0 + c5
	c[9] = c[6] ^ c[0] ^ c[15];
	c[10] = c[7] ^ c[1] ^ c[16];
	c[11] = c[8] ^ c[2] ^ c[17];
	// c4 <- c3 + c0 + c1
	c[12] = c[9] ^ c[0] ^ c[3];
	c[13] = c[10] ^ c[1] ^ c[4];
	c[14] = c[11] ^ c[2] ^ c[5];
	// t2 <- a0 + a1
	t[6] = a[0] ^ a[3];
	t[7] = a[1] ^ a[4];
	t[8] = a[2] ^ a[5];
	// t3 <- b0 + b1
	t[9] = b[0] ^ b[3];
	t[10] = b[1] ^ b[4];
	t[11] = b[2] ^ b[5];
	// t4 <- a0 + a2
	t[12] = a[0] ^ a[6];
	t[13] = a[1] ^ a[7];
	t[14] = a[2] ^ a[8];
	// t5 <- b0 + b2
	t[15] = b[0] ^ b[6];
	t[16] = b[1] ^ b[7];
	t[17] = b[2] ^ b[8];
	// t1 || t0 <- t2 t3
	ppMul3(t, t + 6, t + 9, t + 18);
	// c1 <- c1 + t0
	c[3] ^= t[0];
	c[4] ^= t[1];
	c[5] ^= t[2];
	// c2 <- c2 + t1
	c[6] ^= t[3];
	c[7] ^= t[4];
	c[8] ^= t[5];
	// t1 || t0 <- t4 t5
	ppMul3(t, t + 12, t + 15, t + 18);
	// c2 <- c2 + t0
	c[6] ^= t[0];
	c[7] ^= t[1];
	c[8] ^= t[2];
	// c3 <- c3 + t1
	c[9] ^= t[3];
	c[10] ^= t[4];
	c[11] ^= t[5];
	// t4 <- t4 + t2
	t[12] ^= t[6];
	t[13] ^= t[7];
	t[14] ^= t[8];
	// t5 <- t5 + t3
	t[15] ^= t[9];
	t[16] ^= t[10];
	t[17] ^= t[11];
	// t1 || t0 <- t4 t5
	ppMul3(t, t + 12, t + 15, t + 18);
	// c3 <- c3 + t0
	c[9] ^= t[0];
	c[10] ^= t[1];
	c[11] ^= t[2];
	// c4 <- c4 + t1
	c[12] ^= t[3];
	c[13] ^= t[4];
	c[14] ^= t[5];
}